

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadProgram.cpp
# Opt level: O0

string * ReadProgram_abi_cxx11_(void)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  long *plVar3;
  string *in_RDI;
  char local_235;
  char ch;
  char local_220 [8];
  ifstream in;
  char *inputfilename;
  string *ret;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,0x15a004);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"Failed to open file.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&ch);
    std::allocator<char>::~allocator((allocator<char> *)&ch);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    while( true ) {
      plVar3 = (long *)std::istream::get(local_220);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::string::operator+=((string *)in_RDI,local_235);
    }
  }
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

std::string ReadProgram() {
    char *inputfilename = "test.txt";
    std::ifstream in;
    in.open(inputfilename);
    if (!in.is_open()) {//未能打开文件
        std::cout << "Failed to open file." << std::endl;
        return "";
    }
    char ch;
    std::string ret;
    while (in.get(ch)) {
        ret += ch;
    }
    return ret;
}